

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_endian.cpp
# Opt level: O1

uint32_t spvFixWord(uint32_t word,spv_endianness_t endian)

{
  uint uVar1;
  
  uVar1 = word >> 0x18 | (word & 0xff0000) >> 8 | (word & 0xff00) << 8 | word << 0x18;
  if (endian != SPV_ENDIANNESS_BIG) {
    uVar1 = word;
  }
  return uVar1;
}

Assistant:

uint32_t spvFixWord(const uint32_t word, const spv_endianness_t endian) {
  if ((SPV_ENDIANNESS_LITTLE == endian && I32_ENDIAN_HOST == I32_ENDIAN_BIG) ||
      (SPV_ENDIANNESS_BIG == endian && I32_ENDIAN_HOST == I32_ENDIAN_LITTLE)) {
    return (word & 0x000000ff) << 24 | (word & 0x0000ff00) << 8 |
           (word & 0x00ff0000) >> 8 | (word & 0xff000000) >> 24;
  }

  return word;
}